

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipasir.cc
# Opt level: O2

int __thiscall IPAsirMiniSAT::solve(IPAsirMiniSAT *this,bool simp)

{
  lbool lVar1;
  bool bVar2;
  undefined8 in_RAX;
  int iVar3;
  undefined7 uStack_28;
  lbool res;
  
  this->calls = this->calls + 1;
  _uStack_28 = in_RAX;
  reset(this);
  iVar3 = 0;
  lVar1 = Minisat::SimpSolver::solveLimited(&this->super_SimpSolver,&this->assumptions,simp,false);
  _uStack_28 = CONCAT17(lVar1.value,uStack_28);
  if ((this->assumptions).data != (Lit *)0x0) {
    (this->assumptions).sz = 0;
  }
  bVar2 = Minisat::lbool::operator!=(&res,(lbool)0x0);
  this->nomodel = bVar2;
  bVar2 = Minisat::lbool::operator==(&res,(lbool)0x2);
  if (!bVar2) {
    bVar2 = Minisat::lbool::operator==(&res,(lbool)0x0);
    iVar3 = 0x14;
    if (bVar2) {
      iVar3 = 10;
    }
  }
  return iVar3;
}

Assistant:

int solve(bool simp = false)
    {
        calls++;
        reset();
        lbool res = solveLimited(assumptions, simp);
        assumptions.clear();
        nomodel = (res != l_True);
        return (res == l_Undef) ? 0 : (res == l_True ? 10 : 20);
    }